

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# auxlib.c
# Opt level: O1

int find_text(char **texts,size_t n_texts,char *key)

{
  int iVar1;
  size_t sVar2;
  
  if ((key != (char *)0x0 && (n_texts != 0 && texts != (char **)0x0)) && (*key != '\0')) {
    sVar2 = 0;
    do {
      iVar1 = strcmp(texts[sVar2],key);
      if (iVar1 == 0) {
        return (int)sVar2;
      }
      sVar2 = sVar2 + 1;
    } while (n_texts != sVar2);
  }
  return -1;
}

Assistant:

int 
find_text(char* const* texts, size_t n_texts, const char* key) 
{
	size_t ind;
	
	/* if there's not where to find, return nothing was found */
	if ((NULL == texts) || (0 == n_texts)) {
		return -1;
	}
	
	/* if there's not what to find, return nothing was found */
	if ( (NULL == key) || (0 == strlen(key)) ) {
		return -1;
	}
	
	for (ind = 0; ind < n_texts; ind++) {
		if (!strcmp(texts[ind], key)) {
			return ind;
		}
	}
	
	return -1;
}